

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbutton.cpp
# Opt level: O1

QSize __thiscall QToolButton::sizeHint(QToolButton *this)

{
  long lVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  undefined8 uVar5;
  QStyle *pQVar6;
  QSize QVar7;
  Representation RVar8;
  int iVar9;
  Representation RVar10;
  long in_FS_OFFSET;
  QFontMetrics fm;
  QStyleOptionToolButton opt;
  QString local_f0;
  undefined1 *local_d8;
  QStyleOptionToolButton local_d0;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QAbstractButton).super_QWidget.field_0x8;
  if ((*(int *)(lVar1 + 0x2ac) < 0) || (*(int *)(lVar1 + 0x2b0) < 0)) {
    QWidget::ensurePolished((QWidget *)this);
    memset(&local_d0,0xaa,0x98);
    QStyleOptionToolButton::QStyleOptionToolButton(&local_d0);
    (**(code **)(*(long *)&(this->super_QAbstractButton).super_QWidget + 0x1b8))(this,&local_d0);
    local_d8 = &DAT_aaaaaaaaaaaaaaaa;
    QFontMetrics::QFontMetrics
              ((QFontMetrics *)&local_d8,&((this->super_QAbstractButton).super_QWidget.data)->fnt);
    RVar10.m_i = local_d0.iconSize.wd.m_i.m_i;
    if (local_d0.toolButtonStyle == ToolButtonTextOnly) {
      RVar10.m_i = 0;
    }
    RVar8.m_i = local_d0.iconSize.ht.m_i.m_i;
    if (local_d0.toolButtonStyle == ToolButtonTextOnly) {
      RVar8.m_i = 0;
    }
    iVar9 = RVar8.m_i;
    iVar3 = RVar10.m_i;
    if (local_d0.toolButtonStyle != ToolButtonIconOnly) {
      QAbstractButton::text(&local_f0,&this->super_QAbstractButton);
      uVar5 = QFontMetrics::size((int)&local_d8,(QString *)0x800,(int)&local_f0,(int *)0x0);
      iVar9 = (int)((ulong)uVar5 >> 0x20);
      piVar2 = (int *)CONCAT44(local_f0.d.d._4_4_,(int)local_f0.d.d);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          QArrayData::deallocate
                    ((QArrayData *)CONCAT44(local_f0.d.d._4_4_,(int)local_f0.d.d),2,0x10);
        }
      }
      iVar3 = QFontMetrics::horizontalAdvance((QChar)(char16_t)&local_d8);
      iVar4 = (int)uVar5 + iVar3 * 2;
      if (local_d0.toolButtonStyle == ToolButtonTextBesideIcon) {
        iVar3 = RVar10.m_i + iVar4 + 4;
        if (iVar9 < RVar8.m_i) {
          iVar9 = RVar8.m_i;
        }
      }
      else {
        iVar3 = iVar4;
        if ((local_d0.toolButtonStyle == ToolButtonTextUnderIcon) &&
           (iVar9 = RVar8.m_i + iVar9 + 4, iVar3 = RVar10.m_i, RVar10.m_i < iVar4)) {
          iVar3 = iVar4;
        }
      }
    }
    local_d0.super_QStyleOptionComplex.super_QStyleOption.rect.x2.m_i =
         local_d0.super_QStyleOptionComplex.super_QStyleOption.rect.x1.m_i + iVar3 + -1;
    local_d0.super_QStyleOptionComplex.super_QStyleOption.rect.y2.m_i =
         local_d0.super_QStyleOptionComplex.super_QStyleOption.rect.y1.m_i + iVar9 + -1;
    if (*(int *)(lVar1 + 0x2e8) == 1) {
      pQVar6 = QWidget::style((QWidget *)this);
      iVar4 = (**(code **)(*(long *)pQVar6 + 0xe0))(pQVar6,2,&local_d0,this);
      iVar3 = iVar4 + iVar3;
    }
    pQVar6 = QWidget::style((QWidget *)this);
    local_f0.d.d._0_4_ = iVar3;
    local_f0.d.d._4_4_ = iVar9;
    QVar7 = (QSize)(**(code **)(*(long *)pQVar6 + 0xe8))(pQVar6,3,&local_d0,&local_f0,this);
    *(QSize *)(lVar1 + 0x2ac) = QVar7;
    QFontMetrics::~QFontMetrics((QFontMetrics *)&local_d8);
    QFont::~QFont(&local_d0.font);
    if (&(local_d0.text.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_d0.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_d0.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_d0.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_d0.text.d.d)->super_QArrayData,2,0x10);
      }
    }
    QIcon::~QIcon(&local_d0.icon);
    QStyleOption::~QStyleOption((QStyleOption *)&local_d0);
  }
  else {
    QVar7 = *(QSize *)(lVar1 + 0x2ac);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return QVar7;
}

Assistant:

QSize QToolButton::sizeHint() const
{
    Q_D(const QToolButton);
    if (d->sizeHint.isValid())
        return d->sizeHint;
    ensurePolished();

    int w = 0, h = 0;
    QStyleOptionToolButton opt;
    initStyleOption(&opt);

    QFontMetrics fm = fontMetrics();
    if (opt.toolButtonStyle != Qt::ToolButtonTextOnly) {
        QSize icon = opt.iconSize;
        w = icon.width();
        h = icon.height();
    }

    if (opt.toolButtonStyle != Qt::ToolButtonIconOnly) {
        QSize textSize = fm.size(Qt::TextShowMnemonic, text());
        textSize.setWidth(textSize.width() + fm.horizontalAdvance(u' ') * 2);
        if (opt.toolButtonStyle == Qt::ToolButtonTextUnderIcon) {
            h += 4 + textSize.height();
            if (textSize.width() > w)
                w = textSize.width();
        } else if (opt.toolButtonStyle == Qt::ToolButtonTextBesideIcon) {
            w += 4 + textSize.width();
            if (textSize.height() > h)
                h = textSize.height();
        } else { // TextOnly
            w = textSize.width();
            h = textSize.height();
        }
    }

    opt.rect.setSize(QSize(w, h)); // PM_MenuButtonIndicator depends on the height
    if (d->popupMode == MenuButtonPopup)
        w += style()->pixelMetric(QStyle::PM_MenuButtonIndicator, &opt, this);

    d->sizeHint = style()->sizeFromContents(QStyle::CT_ToolButton, &opt, QSize(w, h), this);
    return d->sizeHint;
}